

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  Slice *in_RSI;
  long in_FS_OFFSET;
  uint32_t len;
  Slice *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  Slice *in_stack_ffffffffffffffe0;
  size_t local_18;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = GetVarint32(in_stack_ffffffffffffffe0,
                      (uint32_t *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if ((bVar2) && (sVar3 = Slice::size(in_stack_ffffffffffffffb8), local_c <= sVar3)) {
    Slice::data(in_stack_ffffffffffffffb8);
    Slice::Slice(in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (size_t)in_stack_ffffffffffffffb8);
    in_RSI->data_ = (char *)in_stack_ffffffffffffffe0;
    in_RSI->size_ = local_18;
    Slice::remove_prefix(in_RSI,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}